

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O0

void __thiscall wasm::Instrumenter::addSecondaryMemory(Instrumenter *this,size_t numFuncs)

{
  InstrumenterConfig *pIVar1;
  bool bVar2;
  pointer pMVar3;
  Name name;
  Type local_210;
  bool local_208 [8];
  Address local_200;
  char *local_1f8;
  Address AStack_1f0;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> local_1e8;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> mem;
  size_t pages;
  string_view local_1c0 [2];
  Fatal local_1a0;
  size_t local_18;
  size_t numFuncs_local;
  Instrumenter *this_local;
  
  if (this->config->storageKind == InSecondaryMemory) {
    local_18 = numFuncs;
    numFuncs_local = (size_t)this;
    bVar2 = FeatureSet::hasMultiMemory(&this->wasm->features);
    if (!bVar2) {
      Fatal::Fatal(&local_1a0);
      Fatal::operator<<(&local_1a0,
                        (char (*) [64])
                        "error: --in-secondary-memory requires multimemory to be enabled");
      Fatal::~Fatal(&local_1a0);
    }
    local_1c0[0] = (string_view)
                   Names::getValidMemoryName
                             (this->wasm,(Name)(this->config->secondaryMemoryName).super_IString.str
                             );
    Name::operator=(&this->secondaryMemory,(Name *)local_1c0);
    mem._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (local_18 + 0xffff >> 0x10);
    local_1f8 = (char *)(this->secondaryMemory).super_IString.str._M_len;
    AStack_1f0.addr = (address64_t)(this->secondaryMemory).super_IString.str._M_str;
    Address::Address(&local_200,
                     (uint64_t)
                     mem._M_t.
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    Address::Address((Address *)local_208,
                     (uint64_t)
                     mem._M_t.
                     super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                     super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    Type::Type(&local_210,i32);
    name.super_IString.str._M_str = local_1f8;
    name.super_IString.str._M_len = (size_t)&local_1e8;
    Builder::makeMemory(name,AStack_1f0,local_200,local_208[0],(Type)0x1);
    pIVar1 = this->config;
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_1e8);
    Name::operator=(&(pMVar3->super_Importable).module,&pIVar1->importNamespace);
    pIVar1 = this->config;
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                       (&local_1e8);
    Name::operator=(&(pMVar3->super_Importable).base,&pIVar1->secondaryMemoryName);
    ::wasm::Module::addMemory((unique_ptr *)this->wasm);
    std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::~unique_ptr(&local_1e8);
  }
  return;
}

Assistant:

void Instrumenter::addSecondaryMemory(size_t numFuncs) {
  if (config.storageKind != WasmSplitOptions::StorageKind::InSecondaryMemory) {
    // Don't need secondary memory
    return;
  }
  if (!wasm->features.hasMultiMemory()) {
    Fatal()
      << "error: --in-secondary-memory requires multimemory to be enabled";
  }

  secondaryMemory =
    Names::getValidMemoryName(*wasm, config.secondaryMemoryName);
  // Create a memory with enough pages to write into
  size_t pages = (numFuncs + Memory::kPageSize - 1) / Memory::kPageSize;
  auto mem = Builder::makeMemory(secondaryMemory, pages, pages, true);
  mem->module = config.importNamespace;
  mem->base = config.secondaryMemoryName;
  wasm->addMemory(std::move(mem));
}